

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineoption.cpp
# Opt level: O1

void __thiscall QCommandLineOption::setDescription(QCommandLineOption *this,QString *description)

{
  QCommandLineOptionPrivate *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 != (QCommandLineOptionPrivate *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1)) {
    QSharedDataPointer<QCommandLineOptionPrivate>::detach_helper(&this->d);
  }
  QString::operator=(&((this->d).d.ptr)->description,description);
  return;
}

Assistant:

void QCommandLineOption::setDescription(const QString &description)
{
    d->description = description;
}